

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O0

void __thiscall higan::MultiplexEpoll::MultiplexEpoll(MultiplexEpoll *this)

{
  int iVar1;
  allocator<epoll_event> local_11;
  MultiplexEpoll *local_10;
  MultiplexEpoll *this_local;
  
  local_10 = this;
  MultiplexBase::MultiplexBase(&this->super_MultiplexBase);
  (this->super_MultiplexBase)._vptr_MultiplexBase = (_func_int **)&PTR_UpdateChannel_0018ab98;
  iVar1 = epoll_create(5);
  this->epollfd_ = iVar1;
  std::allocator<epoll_event>::allocator(&local_11);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::vector(&this->epoll_events_,100,&local_11)
  ;
  std::allocator<epoll_event>::~allocator(&local_11);
  return;
}

Assistant:

MultiplexEpoll::MultiplexEpoll():
		epollfd_(epoll_create(5)),
		epoll_events_(EPOLL_MAX_EVNETS)
{
	
}